

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
curlpp::CallbackException<curlpp::UnknowException>::~CallbackException
          (CallbackException<curlpp::UnknowException> *this)

{
  *(undefined ***)&(this->super_CallbackExceptionBase).super_RuntimeError =
       &PTR__CallbackException_00134cf0;
  RuntimeError::~RuntimeError(&(this->mException).super_RuntimeError);
  RuntimeError::~RuntimeError((RuntimeError *)this);
  return;
}

Assistant:

class CURLPPAPI CallbackException : public CallbackExceptionBase
	{

	public: 

		typedef CallbackException<ExceptionType> _CE;

		CallbackException(const ExceptionType & e) 
			: mException(e)
		{}

		virtual void throwMe() 
		{
			throw mException;
		}

		virtual _CE * clone() 
		{
			return new _CE(*this);
		}

	private:

		ExceptionType mException;

	}